

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_subgraph.cpp
# Opt level: O1

void __thiscall
Disa::Adjacency_Subgraph::Adjacency_Subgraph
          (Adjacency_Subgraph *this,Adjacency_Graph<false> *parent_graph,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *i_partition_local_global,
          size_t extra_levels)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  long lVar1;
  source_location *psVar2;
  iterator __position;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_01;
  uint uVar3;
  iterator __beg;
  size_t sVar4;
  ulong uVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  uint uVar8;
  uint uVar9;
  source_location *psVar10;
  pointer puVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  unsigned_long *puVar13;
  pointer puVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong *puVar18;
  source_location *psVar19;
  ulong *puVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  pointer puVar26;
  unsigned_long uVar27;
  uint uVar28;
  size_type sVar29;
  bool bVar30;
  vector<bool,_std::allocator<bool>_> adjacency_delete;
  vector<unsigned_long,_std::allocator<unsigned_long>_> i_global_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> unique_check;
  vector<unsigned_long,_std::allocator<unsigned_long>_> new_indexes;
  undefined1 local_218 [32];
  pointer local_1f8;
  pointer puStack_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  Adjacency_Graph<false> *local_1c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1c0;
  pointer local_1a8;
  long local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  void *local_178;
  long lStack_170;
  long local_168;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_158;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_150;
  size_t local_148;
  unsigned_long local_140;
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_138;
  string local_128;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  Adjacency_Graph<false> *local_d0;
  ulong local_c8;
  pointer local_c0;
  pointer local_b8;
  undefined8 local_b0;
  pointer local_a8;
  ulong local_a0;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined **local_38;
  
  local_1f8 = (pointer)0x0;
  puStack_1f0 = (pointer)0x0;
  local_218._16_8_ = (pointer)0x0;
  local_218._24_8_ = (pointer)0x0;
  local_218._0_8_ = (pointer)0x0;
  local_218._8_8_ = (pointer)0x0;
  local_148 = extra_levels;
  sVar4 = std::hash<Disa::Adjacency_Graph<false>_>::operator()
                    ((hash<Disa::Adjacency_Graph<false>_> *)&local_1e8,
                     (Adjacency_Graph<false> *)local_218);
  Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)local_218);
  this->hash_parent = sVar4;
  local_1c8 = &this->graph;
  local_150 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->i_local_global;
  local_158 = &this->level_set_value;
  (this->graph).vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->graph).vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->graph).vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->graph).offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->graph).offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->graph).offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->i_local_global).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->i_local_global).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->i_local_global).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->level_set_value).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->level_set_value).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->level_set_value).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178 = (void *)0x0;
  lStack_170 = 0;
  local_168 = 0;
  puVar26 = (i_partition_local_global->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar11 = (i_partition_local_global->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (puVar26 != puVar11) {
    std::
    __unique_copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::back_insert_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
              (puVar26,puVar11,&local_178);
  }
  psVar10 = (source_location *)(lStack_170 - (long)local_178);
  puVar16 = (i_partition_local_global->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar18 = (i_partition_local_global->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  psVar19 = (source_location *)((long)puVar18 - (long)puVar16);
  if (psVar10 == psVar19) {
    psVar10 = (source_location *)
              (parent_graph->offset).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    psVar2 = (source_location *)
             (parent_graph->offset).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar17 = ((long)psVar2 - (long)psVar10 >> 3) - 1;
    uVar15 = 0;
    if (psVar2 != psVar10) {
      uVar15 = uVar17;
    }
    if (uVar15 < (ulong)((long)psVar19 >> 3)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      local_1e8._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_00177c78;
      console_format_abi_cxx11_
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                 (Disa *)0x0,(Log_Level)&local_1e8,psVar10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_218._0_8_,local_218._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"Partition size is bigger than graph vertex size.",0x30);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      puVar20 = puVar16;
      if (0 < (long)psVar19 >> 5) {
        puVar20 = (ulong *)(((ulong)psVar19 & 0xffffffffffffffe0) + (long)puVar16);
        lVar25 = ((long)psVar19 >> 5) + 1;
        puVar16 = puVar16 + 2;
        do {
          if ((psVar10 == psVar2) || (uVar17 <= puVar16[-2])) {
            puVar16 = puVar16 + -2;
            goto LAB_00126fca;
          }
          if (uVar17 <= puVar16[-1]) {
            puVar16 = puVar16 + -1;
            goto LAB_00126fca;
          }
          if (uVar17 <= *puVar16) goto LAB_00126fca;
          if (uVar17 <= puVar16[1]) {
            puVar16 = puVar16 + 1;
            goto LAB_00126fca;
          }
          lVar25 = lVar25 + -1;
          puVar16 = puVar16 + 4;
        } while (1 < lVar25);
      }
      lVar25 = (long)puVar18 - (long)puVar20 >> 3;
      if (lVar25 == 1) {
LAB_00126fa2:
        puVar16 = puVar18;
        if (uVar17 <= *puVar20) {
          puVar16 = puVar20;
        }
        if (psVar10 == psVar2) {
          puVar16 = puVar20;
        }
      }
      else if (lVar25 == 2) {
LAB_00126f94:
        puVar16 = puVar20;
        if ((psVar10 != psVar2) && (*puVar20 < uVar17)) {
          puVar20 = puVar20 + 1;
          goto LAB_00126fa2;
        }
      }
      else {
        puVar16 = puVar18;
        if (((lVar25 == 3) && (puVar16 = puVar20, psVar10 != psVar2)) && (*puVar20 < uVar17)) {
          puVar20 = puVar20 + 1;
          goto LAB_00126f94;
        }
      }
LAB_00126fca:
      if (puVar16 == puVar18) {
        sVar4 = std::hash<Disa::Adjacency_Graph<false>_>::operator()
                          ((hash<Disa::Adjacency_Graph<false>_> *)local_218,parent_graph);
        this->hash_parent = sVar4;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&local_1c8->vertex_adjacent_list,&parent_graph->vertex_adjacent_list);
        this_00 = &(this->graph).offset;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (this_00,&parent_graph->offset);
        sVar29 = (long)(i_partition_local_global->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(i_partition_local_global->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(this_00,sVar29 + 1);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  (&local_1c8->vertex_adjacent_list,0);
        this_01 = local_150;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,sVar29);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(local_158,sVar29);
        puVar26 = (parent_graph->offset).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        puVar11 = (parent_graph->offset).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar29 = 0;
        if (puVar26 != puVar11) {
          sVar29 = ((long)puVar26 - (long)puVar11 >> 3) - 1;
        }
        local_218._0_8_ = (pointer)0xffffffffffffffff;
        local_d0 = parent_graph;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_1c0,sVar29,(value_type_conflict *)local_218,(allocator_type *)&local_1e8);
        puVar26 = (i_partition_local_global->
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        puVar11 = (i_partition_local_global->
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        if (puVar26 != puVar11) {
          lVar25 = 0;
          uVar27 = 0;
          do {
            __position._M_current =
                 (this->i_local_global).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->i_local_global).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        (this_01,__position,(unsigned_long *)((long)puVar26 + lVar25));
            }
            else {
              *__position._M_current = puVar26[uVar27];
              (this->i_local_global).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            local_1c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[puVar26[uVar27]] = uVar27;
            uVar27 = uVar27 + 1;
            lVar21 = lVar25 + 8;
            lVar25 = lVar25 + 8;
          } while ((pointer)((long)puVar26 + lVar21) != puVar11);
        }
        local_1e8._M_dataplus._M_p = local_1e8._M_dataplus._M_p & 0xffffffffffffff00;
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)local_218,
                   (long)(this->graph).vertex_adjacent_list.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->graph).vertex_adjacent_list.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3,(bool *)&local_1e8,
                   (allocator_type *)&local_198);
        local_1e8._M_dataplus._M_p = (pointer)0xffffffffffffffff;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_108,
                   (long)(this->graph).vertex_adjacent_list.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->graph).vertex_adjacent_list.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3,(value_type_conflict *)&local_1e8,
                   (allocator_type *)&local_198);
        local_1a8 = (this->graph).offset.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_c0 = (this->graph).offset.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        local_c8 = (long)local_c0 - (long)local_1a8;
        uVar15 = ((long)local_c8 >> 3) - 1;
        if (uVar15 == 0 || local_c8 == 0) {
          lVar25 = 0;
        }
        else {
          puVar26 = (local_1c8->vertex_adjacent_list).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_b8 = local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          local_b0 = 0x800000000000003f;
          uVar17 = 0;
          local_140 = 0;
          local_a8 = (pointer)local_218._0_8_;
          lVar25 = 0;
          do {
            local_1a0 = lVar25;
            uVar23 = local_1a8[uVar17];
            uVar24 = local_1a8[uVar17 + 1];
            uVar5 = uVar23 + 0x3f;
            if (-1 < (long)uVar23) {
              uVar5 = uVar23;
            }
            lVar21 = uVar23 * 8;
            puVar16 = (ulong *)(local_218._0_8_ +
                               (ulong)((uVar23 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                               ((long)uVar5 >> 6) * 8 + -8);
            uVar3 = (uint)uVar23 & 0x3f;
            uVar5 = uVar24 + 0x3f;
            if (-1 < (long)uVar24) {
              uVar5 = uVar24;
            }
            local_1a8[uVar17] = uVar23 - local_1a0;
            lVar1 = uVar24 * 8;
            if (local_1c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar17] == 0xffffffffffffffff) {
              uVar28 = (uint)uVar24 & 0x3f;
              lVar25 = (long)(lVar1 + uVar23 * -8) >> 3;
              puVar18 = puVar16;
              uVar8 = uVar3;
              if (puVar16 !=
                  (ulong *)(local_218._0_8_ +
                           (ulong)((uVar24 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                           ((long)uVar5 >> 6) * 8 + -8) || uVar3 != uVar28) {
                do {
                  *puVar18 = *puVar18 | 1L << ((byte)uVar8 & 0x3f);
                  bVar30 = uVar3 == 0x3f;
                  uVar3 = uVar3 + 1;
                  puVar16 = puVar16 + bVar30;
                  if (bVar30) {
                    uVar3 = 0;
                  }
                  uVar9 = uVar8 + 1;
                  if (uVar8 == 0x3f) {
                    uVar9 = 0;
                  }
                  puVar18 = puVar18 + (uVar8 == 0x3f);
                  uVar8 = uVar9;
                } while ((puVar16 !=
                          (ulong *)(local_218._0_8_ +
                                   (ulong)((uVar24 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                                   ((long)uVar5 >> 6) * 8 + -8)) || (uVar3 != uVar28));
              }
            }
            else {
              local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar17] = local_140;
              if (uVar23 == uVar24) {
                lVar25 = 0;
              }
              else {
                lVar25 = 0;
                lVar22 = lVar21;
                do {
                  lVar25 = lVar25 + (ulong)(local_1c0.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start
                                            [*(long *)((long)puVar26 + lVar22)] ==
                                           0xffffffffffffffff);
                  lVar22 = lVar22 + 8;
                } while (lVar1 - lVar22 != 0);
              }
              local_140 = local_140 + 1;
              if (uVar23 != uVar24) {
                do {
                  uVar23 = 1L << ((byte)uVar3 & 0x3f);
                  if (local_1c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[*(long *)((long)puVar26 + lVar21)] ==
                      0xffffffffffffffff) {
                    uVar23 = uVar23 | *puVar16;
                  }
                  else {
                    uVar23 = ~uVar23 & *puVar16;
                  }
                  *puVar16 = uVar23;
                  bVar30 = uVar3 == 0x3f;
                  uVar3 = uVar3 + 1;
                  if (bVar30) {
                    uVar3 = 0;
                  }
                  puVar16 = puVar16 + bVar30;
                  lVar21 = lVar21 + 8;
                } while (lVar1 - lVar21 != 0);
              }
            }
            lVar25 = lVar25 + local_1a0;
            uVar17 = uVar17 + 1;
            local_a0 = uVar15;
          } while (uVar17 != uVar15);
        }
        local_c0[-1] = local_c0[-1] - lVar25;
        if ((long)local_c8 >> 5 < 1) {
          uVar17 = 0;
          puVar26 = local_1a8;
        }
        else {
          puVar26 = (pointer)((local_c8 & 0xffffffffffffffe0) + (long)local_1a8);
          lVar25 = ((long)local_c8 >> 5) + 1;
          uVar17 = 0;
          uVar23 = 0;
          puVar11 = local_1a8;
          do {
            uVar24 = uVar23;
            if (((local_1a8 != local_c0) && (uVar23 < uVar15)) &&
               (uVar17 = uVar23 + 1, uVar24 = uVar17,
               local_1c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar23] == 0xffffffffffffffff)) goto LAB_00127537;
            uVar23 = uVar24;
            if (((local_1a8 != local_c0) && (uVar24 < uVar15)) &&
               (uVar17 = uVar24 + 1, uVar23 = uVar17,
               local_1c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar24] == 0xffffffffffffffff)) {
              uVar24 = uVar17;
              puVar11 = puVar11 + 1;
              goto LAB_00127537;
            }
            uVar24 = uVar23;
            if (((local_1a8 != local_c0) && (uVar23 < uVar15)) &&
               (uVar17 = uVar23 + 1, uVar24 = uVar17,
               local_1c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar23] == 0xffffffffffffffff)) {
              puVar11 = puVar11 + 2;
              goto LAB_00127537;
            }
            uVar23 = uVar24;
            if (((local_1a8 != local_c0) && (uVar24 < uVar15)) &&
               (uVar17 = uVar24 + 1, uVar23 = uVar17,
               local_1c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar24] == 0xffffffffffffffff)) {
              uVar24 = uVar17;
              puVar11 = puVar11 + 3;
              goto LAB_00127537;
            }
            puVar11 = puVar11 + 4;
            lVar25 = lVar25 + -1;
          } while (1 < lVar25);
        }
        lVar25 = (long)local_c0 - (long)puVar26 >> 3;
        uVar24 = uVar17;
        if (lVar25 == 1) {
LAB_00127513:
          puVar11 = local_c0;
          if (((local_1a8 != local_c0) && (uVar24 < uVar15)) &&
             (puVar14 = local_1c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar24, uVar24 = uVar24 + 1,
             puVar11 = puVar26, *puVar14 != 0xffffffffffffffff)) {
            puVar11 = local_c0;
          }
        }
        else if (lVar25 == 2) {
LAB_001274ea:
          uVar24 = uVar17;
          if (((local_1a8 == local_c0) || (uVar15 <= uVar17)) ||
             (uVar24 = uVar17 + 1, puVar11 = puVar26,
             local_1c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar17] != 0xffffffffffffffff)) {
            puVar26 = puVar26 + 1;
            goto LAB_00127513;
          }
        }
        else {
          puVar11 = local_c0;
          if ((lVar25 == 3) &&
             (((local_1a8 == local_c0 || (uVar15 <= uVar17)) ||
              (uVar24 = uVar17 + 1,
              puVar14 = local_1c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar17, puVar11 = puVar26,
              uVar17 = uVar24, *puVar14 != 0xffffffffffffffff)))) {
            puVar26 = puVar26 + 1;
            goto LAB_001274ea;
          }
        }
LAB_00127537:
        puVar13 = puVar11 + 1;
        if (puVar13 != local_c0 && puVar11 != local_c0) {
          do {
            if (((local_1a8 == local_c0) || (uVar15 <= uVar24)) ||
               (uVar17 = uVar24 + 1,
               puVar26 = local_1c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar24, uVar24 = uVar17,
               *puVar26 != 0xffffffffffffffff)) {
              *puVar11 = *puVar13;
              puVar11 = puVar11 + 1;
            }
            puVar13 = puVar13 + 1;
          } while (puVar13 != local_c0);
        }
        if (puVar11 != local_c0) {
          (this->graph).offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar11;
        }
        puVar26 = (this->graph).vertex_adjacent_list.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar11 = (this->graph).vertex_adjacent_list.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar25 = (long)puVar11 - (long)puVar26 >> 5;
        if (lVar25 < 1) {
          puVar14 = puVar26;
          uVar15 = 0;
        }
        else {
          puVar14 = (pointer)(((long)puVar11 - (long)puVar26 & 0xffffffffffffffe0U) + (long)puVar26)
          ;
          lVar21 = lVar25 + 1;
          uVar17 = 4;
          puVar13 = puVar26;
          do {
            uVar23 = *(ulong *)(local_218._0_8_ + (uVar17 - 4 >> 6) * 8);
            uVar15 = uVar17 - 3;
            if ((uVar23 >> ((uint)(uVar17 - 4) & 0x3c) & 1) != 0) goto LAB_00127750;
            if ((uVar23 >> ((uint)(uVar17 - 3) & 0x3d) & 1) != 0) {
              uVar15 = uVar17 - 2;
              puVar13 = puVar13 + 1;
              goto LAB_00127750;
            }
            if ((uVar23 >> ((uint)(uVar17 - 2) & 0x3e) & 1) != 0) {
              uVar15 = uVar17 - 1;
              puVar13 = puVar13 + 2;
              goto LAB_00127750;
            }
            if ((uVar23 >> (uVar17 - 1 & 0x3f) & 1) != 0) {
              uVar15 = uVar17;
              puVar13 = puVar13 + 3;
              goto LAB_00127750;
            }
            puVar13 = puVar13 + 4;
            uVar17 = uVar17 + 4;
            lVar21 = lVar21 + -1;
            uVar15 = lVar25 * 4;
          } while (1 < lVar21);
        }
        lVar25 = (long)puVar11 - (long)puVar14 >> 3;
        uVar17 = uVar15;
        if (lVar25 == 1) {
LAB_00127713:
          uVar23 = uVar17 + 0x3f;
          if (-1 < (long)uVar17) {
            uVar23 = uVar17;
          }
          uVar15 = uVar17 + 1;
          puVar13 = puVar14;
          if ((*(ulong *)(local_218._0_8_ +
                         (ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                         ((long)uVar23 >> 6) * 8 + -8) >> (uVar17 & 0x3f) & 1) == 0) {
            puVar13 = puVar11;
          }
        }
        else if (lVar25 == 2) {
LAB_001276b7:
          uVar15 = uVar17 + 1;
          uVar23 = uVar17 + 0x3f;
          if (-1 < (long)uVar17) {
            uVar23 = uVar17;
          }
          puVar13 = puVar14;
          if ((*(ulong *)(local_218._0_8_ +
                         (ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                         ((long)uVar23 >> 6) * 8 + -8) >> (uVar17 & 0x3f) & 1) == 0) {
            puVar14 = puVar14 + 1;
            uVar17 = uVar15;
            goto LAB_00127713;
          }
        }
        else {
          puVar13 = puVar11;
          if (lVar25 == 3) {
            uVar17 = uVar15 | 1;
            uVar23 = uVar15 + 0x3f;
            if (-1 < (long)uVar15) {
              uVar23 = uVar15;
            }
            uVar24 = uVar15 & 0x800000000000003c;
            uVar3 = (uint)uVar15;
            uVar15 = uVar17;
            puVar13 = puVar14;
            if ((*(ulong *)(local_218._0_8_ +
                           (ulong)(uVar24 < 0x8000000000000001) * 8 + ((long)uVar23 >> 6) * 8 + -8)
                 >> (uVar3 & 0x3c) & 1) == 0) {
              puVar14 = puVar14 + 1;
              goto LAB_001276b7;
            }
          }
        }
LAB_00127750:
        puVar14 = puVar13;
        if (puVar13 != puVar11) {
          while (puVar14 = puVar14 + 1, puVar14 != puVar11) {
            uVar17 = uVar15 + 0x3f;
            if (-1 < (long)uVar15) {
              uVar17 = uVar15;
            }
            if ((*(ulong *)(local_218._0_8_ +
                           (ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                           ((long)uVar17 >> 6) * 8 + -8) >> (uVar15 & 0x3f) & 1) == 0) {
              *puVar13 = *puVar14;
              puVar13 = puVar13 + 1;
            }
            uVar15 = uVar15 + 1;
          }
        }
        if (puVar13 != puVar11) {
          (this->graph).vertex_adjacent_list.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar13;
        }
        puVar11 = (this->graph).vertex_adjacent_list.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (puVar14 = puVar26; puVar14 != puVar11; puVar14 = puVar14 + 1) {
          *puVar14 = local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[*puVar14];
        }
        psVar10 = (source_location *)((long)puVar11 - (long)puVar26 >> 3);
        if ((source_location *)
            (this->graph).offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1] == psVar10) {
          if (local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_108.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_108.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_108.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((pointer)local_218._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_218._0_8_,(long)local_1f8 - local_218._0_8_);
            local_218._0_8_ = (pointer)0x0;
            local_218._8_8_ = local_218._8_8_ & 0xffffffff00000000;
            local_218._16_8_ = (pointer)0x0;
            local_218._24_8_ = local_218._24_8_ & 0xffffffff00000000;
            local_1f8 = (pointer)0x0;
          }
          if (local_148 != 0) {
            local_138.
            super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                      (&local_138.
                        super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> **)&local_138,
                       (allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                       local_218,&local_1c0);
            update_levels(this,local_d0,local_148,&local_138);
            if (local_138.
                super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_138.
                         super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
          }
          if (local_1c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1c0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_1c0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1c0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_178 != (void *)0x0) {
            operator_delete(local_178,local_168 - (long)local_178);
          }
          return;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
        local_38 = &PTR_s__workspace_llm4binary_github_lic_00177d38;
        console_format_abi_cxx11_(&local_1e8,(Disa *)0x0,(Log_Level)&local_38,psVar10);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_1e8._M_dataplus._M_p,
                            local_1e8._M_string_length);
        std::__cxx11::to_string
                  (&local_78,
                   (this->graph).offset.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1]);
        std::operator+(&local_58,
                       "Total offsets no longer match vertex size while reducing to subgraph, ",
                       &local_78);
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_58," vs. ");
        local_f0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
        paVar12 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p == paVar12) {
          local_f0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        }
        else {
          local_f0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        local_f0._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar12;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::to_string
                  (&local_98,
                   (long)(this->graph).vertex_adjacent_list.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->graph).vertex_adjacent_list.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3);
        std::operator+(&local_128,&local_f0,&local_98);
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_128,".");
        local_198._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
        paVar12 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p == paVar12) {
          local_198.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        }
        else {
          local_198.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        local_198._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar12;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_198._M_dataplus._M_p,local_198._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar6);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_78);
        pbVar7 = &local_1e8;
        goto LAB_001279bc;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      local_f0._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_00177c90;
      console_format_abi_cxx11_
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                 (Disa *)0x0,(Log_Level)&local_f0,psVar10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_218._0_8_,local_218._8_8_);
      puVar26 = (parent_graph->offset).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      puVar11 = (parent_graph->offset).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar27 = 0;
      if (puVar26 != puVar11) {
        uVar27 = ((long)puVar26 - (long)puVar11 >> 3) - 1;
      }
      std::__cxx11::to_string(&local_128,uVar27);
      std::operator+(&local_198,"A global vertex is not in the parsed parent graph range [0, ",
                     &local_128);
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_198,").");
      local_1e8._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
      paVar12 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p == paVar12) {
        local_1e8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_1e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      }
      else {
        local_1e8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_1e8._M_string_length = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_128);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_1e8._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_00177c60;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
               (Disa *)0x0,(Log_Level)&local_1e8,psVar10);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_218._0_8_,local_218._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"Partition vertices are not unique.",0x22);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218;
LAB_001279bc:
  std::__cxx11::string::~string((string *)pbVar7);
  exit(1);
}

Assistant:

Adjacency_Subgraph::Adjacency_Subgraph(const Adjacency_Graph<false>& parent_graph,
                                       const std::vector<std::size_t>& i_partition_local_global,
                                       const std::size_t extra_levels) {
#ifdef DISA_DEBUG
  std::vector<std::size_t> unique_check;
  std::unique_copy(i_partition_local_global.begin(), i_partition_local_global.end(), std::back_inserter(unique_check));
  ASSERT(unique_check.size() == i_partition_local_global.size(), "Partition vertices are not unique.");
  ASSERT(i_partition_local_global.size() <= parent_graph.size_vertex(),
         "Partition size is bigger than graph vertex size.");
  ASSERT(
  !std::any_of(i_partition_local_global.begin(), i_partition_local_global.end(),
               [&](const std::size_t i_global) { return i_global >= parent_graph.size_vertex(); }),
  "A global vertex is not in the parsed parent graph range [0, " + std::to_string(parent_graph.size_vertex()) + ").");
#endif

  hash_parent = std::hash<Adjacency_Graph<false>>{}(parent_graph);
  graph = parent_graph;
  reserve(i_partition_local_global.size());

  // Copy the contents of the graph into the sub-graph and set up axillary containers.
  std::size_t i_local_vertex = 0;
  std::vector<std::size_t> i_global_local(parent_graph.size_vertex(), std::numeric_limits<std::size_t>::max());
  FOR_EACH(i_global_vertex, i_partition_local_global) {
    i_local_global.push_back(i_global_vertex);
    i_global_local[i_global_vertex] = i_local_vertex;
    ++i_local_vertex;
  }

  // Remove vertices not in this subgraph.
  auto not_in_subgraph = [&](const std::size_t& vertex) {
    return i_global_local[vertex] == std::numeric_limits<std::size_t>::max();
  };
  graph.erase_if(not_in_subgraph);

  // Add back additional levels as needed.
  if(extra_levels != 0)
    update_levels(parent_graph, extra_levels, std::make_shared<std::vector<std::size_t>>(i_global_local));
}